

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

void testMiscMatrixAlgo(void)

{
  ostream *poVar1;
  exception *e;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing misc functions in ImathMatrixAlgo.h");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing the building of an orthonormal direct frame from : a position, "
                          );
  poVar1 = std::operator<<(poVar1,"an x axis direction and a normal to the y axis");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"IMATH_INTERNAL_NAMESPACE::computeLocalFrame()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_7c237::testComputeLocalFrame();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Add a translate/rotate/scale offset to an input frame ");
  poVar1 = std::operator<<(poVar1,"and put it in another frame of reference");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"IMATH_INTERNAL_NAMESPACE::addOffset()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_7c237::testAddOffset();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Compute Translate/Rotate/Scale matrix from matrix A ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"with the Rotate/Scale of Matrix B");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"IMATH_INTERNAL_NAMESPACE::computeRSMatrix()");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_7c237::testComputeRSMatrix();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testMiscMatrixAlgo ()
{
    try
    {
        cout << "Testing misc functions in ImathMatrixAlgo.h" << endl;

        cout
            << "Testing the building of an orthonormal direct frame from : a position, "
            << "an x axis direction and a normal to the y axis" << endl;
        cout << "IMATH_INTERNAL_NAMESPACE::computeLocalFrame()" << endl;

        testComputeLocalFrame ();

        cout << "ok\n" << endl;

        cout << "Add a translate/rotate/scale offset to an input frame "
             << "and put it in another frame of reference" << endl;
        cout << "IMATH_INTERNAL_NAMESPACE::addOffset()" << endl;

        testAddOffset ();

        cout << "ok\n" << endl;

        cout << "Compute Translate/Rotate/Scale matrix from matrix A " << endl;
        cout << "with the Rotate/Scale of Matrix B" << endl;
        cout << "IMATH_INTERNAL_NAMESPACE::computeRSMatrix()" << endl;

        testComputeRSMatrix ();

        cout << "ok\n" << endl;
    }
    catch (std::exception& e)
    {
        cerr << "  Caught exception: " << e.what () << endl;
    }
}